

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

void evmap_io_active_(event_base *base,int fd,short events)

{
  undefined8 *puVar1;
  event *ev;
  ushort uVar2;
  
  if (((-1 < fd) && (fd < (base->io).nentries)) &&
     (puVar1 = (undefined8 *)(base->io).entries[(uint)fd], puVar1 != (undefined8 *)0x0)) {
    for (ev = (event *)*puVar1; ev != (event *)0x0; ev = (ev->ev_).ev_io.ev_io_next.le_next) {
      uVar2 = ev->ev_events & events;
      if (uVar2 != 0) {
        event_active_nolock_(ev,(int)(short)uVar2,1);
      }
    }
  }
  return;
}

Assistant:

void
evmap_io_active_(struct event_base *base, evutil_socket_t fd, short events)
{
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx;
	struct event *ev;

#ifndef EVMAP_USE_HT
	if (fd < 0 || fd >= io->nentries)
		return;
#endif
	GET_IO_SLOT(ctx, io, fd, evmap_io);

	if (NULL == ctx)
		return;
	LIST_FOREACH(ev, &ctx->events, ev_io_next) {
		if (ev->ev_events & events)
			event_active_nolock_(ev, ev->ev_events & events, 1);
	}
}